

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QList<std::pair<int,_int>_> * __thiscall
QTreeViewPrivate::columnRanges
          (QList<std::pair<int,_int>_> *__return_storage_ptr__,QTreeViewPrivate *this,
          QModelIndex *topIndex,QModelIndex *bottomIndex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  int c;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  pair<int,_int> local_60;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QHeaderView::visualIndex(this->header,topIndex->c);
  iVar3 = QHeaderView::visualIndex(this->header,bottomIndex->c);
  iVar6 = iVar3;
  if (iVar2 < iVar3) {
    iVar6 = iVar2;
  }
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (int *)0x0;
  local_58.size = 0;
  for (; iVar6 <= iVar3; iVar6 = iVar6 + 1) {
    iVar2 = QHeaderView::logicalIndex(this->header,iVar6);
    bVar1 = QHeaderView::isSectionHidden(this->header,iVar2);
    if (!bVar1) {
      QList<int>::append((QList<int> *)&local_58,iVar2);
    }
  }
  iVar4 = QList<int>::begin((QList<int> *)&local_58);
  iVar5 = QList<int>::end((QList<int> *)&local_58);
  std::__sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar4.i,iVar5.i);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<int,_int> *)0x0;
  local_60.first = -2;
  local_60.second = -2;
  iVar6 = -2;
  iVar3 = -2;
  for (uVar7 = 0; uVar7 < (ulong)local_58.size; uVar7 = uVar7 + 1) {
    iVar2 = local_58.ptr[uVar7];
    if (iVar3 + 1 == iVar2) {
      iVar3 = local_60.first;
    }
    else {
      bVar1 = iVar6 != -2;
      iVar6 = iVar2;
      iVar3 = iVar2;
      if (bVar1) {
        QList<std::pair<int,int>>::emplaceBack<std::pair<int,int>const&>
                  ((QList<std::pair<int,int>> *)__return_storage_ptr__,&local_60);
      }
    }
    local_60.second = iVar2;
    local_60.first = iVar3;
    iVar3 = iVar2;
  }
  if (iVar6 != -2) {
    QList<std::pair<int,int>>::emplaceBack<std::pair<int,int>const&>
              ((QList<std::pair<int,int>> *)__return_storage_ptr__,&local_60);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<int, int>> QTreeViewPrivate::columnRanges(const QModelIndex &topIndex,
                                                          const QModelIndex &bottomIndex) const
{
    const int topVisual = header->visualIndex(topIndex.column()),
        bottomVisual = header->visualIndex(bottomIndex.column());

    const int start = qMin(topVisual, bottomVisual);
    const int end = qMax(topVisual, bottomVisual);

    QList<int> logicalIndexes;

    //we iterate over the visual indexes to get the logical indexes
    for (int c = start; c <= end; c++) {
        const int logical = header->logicalIndex(c);
        if (!header->isSectionHidden(logical)) {
            logicalIndexes << logical;
        }
    }
    //let's sort the list
    std::sort(logicalIndexes.begin(), logicalIndexes.end());

    QList<std::pair<int, int>> ret;
    std::pair<int, int> current;
    current.first = -2; // -1 is not enough because -1+1 = 0
    current.second = -2;
    for(int i = 0; i < logicalIndexes.size(); ++i) {
        const int logicalColumn = logicalIndexes.at(i);
        if (current.second + 1 != logicalColumn) {
            if (current.first != -2) {
                //let's save the current one
                ret += current;
            }
            //let's start a new one
            current.first = current.second = logicalColumn;
        } else {
            current.second++;
        }
    }

    //let's get the last range
    if (current.first != -2) {
        ret += current;
    }

    return ret;
}